

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void stack_node_release(StackNode *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  uint uVar1;
  Subtree SVar2;
  uint32_t uVar3;
  long lVar4;
  StackNode *pSVar5;
  
  while( true ) {
    if (self->ref_count == 0) {
      __assert_fail("self->ref_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x60,"void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
    }
    uVar3 = self->ref_count - 1;
    self->ref_count = uVar3;
    if (uVar3 != 0) break;
    if ((ulong)self->link_count == 0) {
      pSVar5 = (StackNode *)0x0;
    }
    else {
      for (lVar4 = (ulong)self->link_count * 0x18; lVar4 != 0x18; lVar4 = lVar4 + -0x18) {
        pSVar5 = *(StackNode **)((long)(self->links + -1) + lVar4);
        SVar2 = *(Subtree *)((long)self->links + lVar4 + -0x10);
        if (SVar2.ptr != (SubtreeHeapData *)0x0) {
          ts_subtree_release(subtree_pool,SVar2);
        }
        stack_node_release(pSVar5,pool,subtree_pool);
      }
      SVar2 = self->links[0].subtree;
      if (SVar2.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_release(subtree_pool,SVar2);
      }
      pSVar5 = self->links[0].node;
    }
    if (pool->size < 0x32) {
      array__grow((VoidArray *)pool,8);
      uVar1 = pool->size;
      pool->size = uVar1 + 1;
      pool->contents[uVar1] = self;
    }
    else {
      free(self);
    }
    self = pSVar5;
    if (pSVar5 == (StackNode *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

static void stack_node_release(StackNode *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
recur:
  assert(self->ref_count != 0);
  self->ref_count--;
  if (self->ref_count > 0) return;

  StackNode *first_predecessor = NULL;
  if (self->link_count > 0) {
    for (unsigned i = self->link_count - 1; i > 0; i--) {
      StackLink link = self->links[i];
      if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
      stack_node_release(link.node, pool, subtree_pool);
    }
    StackLink link = self->links[0];
    if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
    first_predecessor = self->links[0].node;
  }

  if (pool->size < MAX_NODE_POOL_SIZE) {
    array_push(pool, self);
  } else {
    ts_free(self);
  }

  if (first_predecessor) {
    self = first_predecessor;
    goto recur;
  }
}